

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

TryEmplaceResult * __thiscall
QHash<QSimplexVariable*,double>::tryEmplace_impl<QSimplexVariable*const&>
          (TryEmplaceResult *__return_storage_ptr__,QHash<QSimplexVariable*,double> *this,
          QSimplexVariable **key)

{
  uchar uVar1;
  Span *pSVar2;
  Bucket BVar3;
  long lVar4;
  size_t hash;
  Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *pDVar5;
  Node<QSimplexVariable_*,_double> *pNVar6;
  long in_FS_OFFSET;
  Bucket BVar7;
  Bucket local_50;
  QHash<QSimplexVariable_*,_double> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)this;
  if (lVar4 == 0) {
    QHash<QSimplexVariable_*,_double>::detach((QHash<QSimplexVariable_*,_double> *)this);
    lVar4 = *(long *)this;
  }
  local_40.d = (Data *)0x0;
  hash = qHash<QSimplexVariable_*,_true>(key,*(size_t *)(lVar4 + 0x18));
  BVar7 = QHashPrivate::Data<QHashPrivate::Node<QSimplexVariable*,double>>::
          findBucketWithHash<QSimplexVariable*>
                    (*(Data<QHashPrivate::Node<QSimplexVariable*,double>> **)this,key,hash);
  uVar1 = (BVar7.span)->offsets[BVar7.index];
  pDVar5 = *(Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> **)this;
  local_50 = BVar7;
  if ((pDVar5 == (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0) ||
     (1 < (uint)(pDVar5->ref).atomic._q_value.super___atomic_base<int>)) {
LAB_00569521:
    QHash<QSimplexVariable_*,_double>::operator=
              (&local_40,(QHash<QSimplexVariable_*,_double> *)this);
    pDVar5 = *(Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> **)this;
    if ((uVar1 == 0xff) && (pDVar5->numBuckets >> 1 <= pDVar5->size)) {
      pDVar5 = QHashPrivate::Data<QHashPrivate::Node<QSimplexVariable_*,_double>_>::detached
                         (pDVar5,pDVar5->size + 1);
      *(Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> **)this = pDVar5;
      local_50 = QHashPrivate::Data<QHashPrivate::Node<QSimplexVariable*,double>>::
                 findBucketWithHash<QSimplexVariable*>
                           ((Data<QHashPrivate::Node<QSimplexVariable*,double>> *)pDVar5,key,hash);
    }
    else {
      pSVar2 = pDVar5->spans;
      pDVar5 = QHashPrivate::Data<QHashPrivate::Node<QSimplexVariable_*,_double>_>::detached(pDVar5)
      ;
      *(Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> **)this = pDVar5;
      local_50.index._0_4_ = (uint)BVar7.index & 0x7f;
      BVar3.index._0_4_ = (uint)local_50.index;
      BVar3.span = pDVar5->spans +
                   ((((long)BVar7.span - (long)pSVar2) / 0x90 << 7 | BVar7.index) >> 7);
      BVar3.index._4_4_ = 0;
      local_50.span =
           pDVar5->spans + ((((long)BVar7.span - (long)pSVar2) / 0x90 << 7 | BVar7.index) >> 7);
      local_50.index._4_4_ = 0;
      if (uVar1 != 0xff) {
        pDVar5 = *(Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> **)this;
        BVar7 = BVar3;
        goto LAB_005695e6;
      }
    }
  }
  else {
    if (uVar1 != 0xff) goto LAB_005695e6;
    if (pDVar5->numBuckets >> 1 <= pDVar5->size) goto LAB_00569521;
  }
  pNVar6 = QHashPrivate::Data<QHashPrivate::Node<QSimplexVariable_*,_double>_>::Bucket::insert
                     (&local_50);
  pNVar6->key = *key;
  pNVar6->value = 0.0;
  pDVar5 = *(Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> **)this;
  pDVar5->size = pDVar5->size + 1;
  BVar7 = local_50;
LAB_005695e6:
  pSVar2 = pDVar5->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar5;
  (__return_storage_ptr__->iterator).i.bucket =
       ((long)BVar7.span - (long)pSVar2) / 0x90 << 7 | BVar7.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QSimplexVariable_*,_double>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }